

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<12,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_2> *pVVar1;
  int i;
  bool bVar2;
  long lVar3;
  Vector<float,_2> *pVVar4;
  float *pfVar5;
  int col;
  long lVar6;
  int c;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float local_a8 [8];
  float afStack_88 [2];
  Matrix<float,_2,_3> retVal_1;
  float local_68 [2];
  Matrix<float,_2,_3> retVal;
  Vector<float,_3> res;
  Mat3x2 m;
  int local_18 [4];
  long lVar13;
  
  pVVar1 = (Vector<float,_2> *)(retVal.m_data.m_data[1].m_data + 1);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pVVar4 = retVal.m_data.m_data + 1;
    bVar14 = true;
    do {
      bVar2 = bVar14;
      lVar6 = 0;
      auVar11 = _DAT_00ac4b30;
      do {
        bVar14 = SUB164(auVar11 ^ _DAT_00ac4b80,4) == -0x80000000 &&
                 SUB164(auVar11 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
        if (bVar14) {
          fVar16 = 1.0;
          if (lVar3 != lVar6) {
            fVar16 = 0.0;
          }
          pVVar4[lVar6].m_data[0] = fVar16;
        }
        if (bVar14) {
          fVar16 = 1.0;
          if (lVar3 + -1 != lVar6) {
            fVar16 = 0.0;
          }
          pVVar4[lVar6 + 1].m_data[0] = fVar16;
        }
        lVar6 = lVar6 + 2;
        lVar13 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar13 + 2;
      } while (lVar6 != 4);
      lVar3 = 1;
      pVVar4 = pVVar1;
      bVar14 = false;
    } while (bVar2);
    retVal.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    retVal.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  }
  else {
    retVal.m_data.m_data[1].m_data[0] = 0.0;
    retVal.m_data.m_data[1].m_data[1] = 0.0;
    retVal.m_data.m_data[2].m_data[0] = 0.0;
    retVal.m_data.m_data[2].m_data[1] = 0.0;
    lVar3 = 0;
    pVVar4 = retVal.m_data.m_data + 1;
    bVar14 = true;
    do {
      bVar2 = bVar14;
      lVar6 = 0;
      do {
        pVVar4[lVar6].m_data[0] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat3x2 + lVar3 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar3 = 0xc;
      pVVar4 = pVVar1;
      bVar14 = false;
    } while (bVar2);
  }
  afStack_88[0] = 0.0;
  afStack_88[1] = 0.0;
  retVal_1.m_data.m_data[0].m_data[0] = 0.0;
  retVal_1.m_data.m_data[0].m_data[1] = 0.0;
  retVal_1.m_data.m_data[1].m_data[0] = 0.0;
  retVal_1.m_data.m_data[1].m_data[1] = 0.0;
  lVar3 = 0;
  pfVar5 = afStack_88;
  bVar14 = true;
  do {
    bVar2 = bVar14;
    lVar6 = 0;
    auVar12 = _DAT_00ac4b30;
    do {
      bVar14 = SUB164(auVar12 ^ _DAT_00ac4b80,4) == -0x80000000 &&
               SUB164(auVar12 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
      if (bVar14) {
        fVar16 = 1.0;
        if (lVar3 != lVar6) {
          fVar16 = 0.0;
        }
        pfVar5[lVar6 * 2] = fVar16;
      }
      if (bVar14) {
        fVar16 = 1.0;
        if (lVar3 + -1 != lVar6) {
          fVar16 = 0.0;
        }
        pfVar5[lVar6 * 2 + 2] = fVar16;
      }
      lVar6 = lVar6 + 2;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
    } while (lVar6 != 4);
    lVar3 = 1;
    pfVar5 = afStack_88 + 1;
    bVar14 = false;
  } while (bVar2);
  pfVar5 = afStack_88;
  pVVar4 = retVal.m_data.m_data + 1;
  bVar14 = true;
  do {
    bVar2 = bVar14;
    lVar3 = 0;
    do {
      pfVar5[lVar3 * 2] = pVVar4[lVar3].m_data[0] + -1.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pfVar5 = afStack_88 + 1;
    pVVar4 = pVVar1;
    bVar14 = false;
  } while (bVar2);
  fVar9 = afStack_88[0] + afStack_88[1];
  fVar10 = retVal_1.m_data.m_data[0].m_data[1] + retVal_1.m_data.m_data[0].m_data[0];
  m.m_data.m_data[0].m_data[0] = fVar9;
  m.m_data.m_data[0].m_data[1] = fVar10;
  m.m_data.m_data[1].m_data[0] =
       retVal_1.m_data.m_data[1].m_data[0] + retVal_1.m_data.m_data[1].m_data[1];
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = 0.0;
  lVar3 = 0;
  pfVar5 = local_a8;
  bVar14 = true;
  do {
    bVar2 = bVar14;
    lVar6 = 0;
    auVar15 = _DAT_00ac4b30;
    do {
      bVar14 = SUB164(auVar15 ^ _DAT_00ac4b80,4) == -0x80000000 &&
               SUB164(auVar15 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
      if (bVar14) {
        fVar16 = 1.0;
        if (lVar3 != lVar6) {
          fVar16 = 0.0;
        }
        pfVar5[lVar6 * 2] = fVar16;
      }
      if (bVar14) {
        fVar16 = 1.0;
        if (lVar3 + -1 != lVar6) {
          fVar16 = 0.0;
        }
        pfVar5[lVar6 * 2 + 2] = fVar16;
      }
      lVar6 = lVar6 + 2;
      lVar13 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar13 + 2;
    } while (lVar6 != 4);
    lVar3 = 1;
    pfVar5 = local_a8 + 1;
    bVar14 = false;
  } while (bVar2);
  pfVar5 = local_a8;
  pVVar4 = retVal.m_data.m_data + 1;
  bVar14 = true;
  do {
    bVar2 = bVar14;
    lVar3 = 0;
    do {
      pfVar5[lVar3 * 2] = pVVar4[lVar3].m_data[0] + -1.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pfVar5 = local_a8 + 1;
    pVVar4 = pVVar1;
    bVar14 = false;
  } while (bVar2);
  fVar7 = local_a8[0] + local_a8[1];
  fVar8 = local_a8[3] + local_a8[2];
  res.m_data[0] = fVar7;
  res.m_data[1] = fVar8;
  res.m_data[2] = local_a8[4] + local_a8[5];
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  lVar3 = 0;
  do {
    *(float *)((long)(retVal.m_data.m_data + -1) + lVar3 * 4) =
         m.m_data.m_data[0].m_data[lVar3] + res.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_18[lVar3 + -2]] = retVal_1.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}